

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::
         StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::convert(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  int iVar4;
  IMutableContext *pIVar5;
  undefined4 extraout_var;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar5 = getCurrentMutableContext();
  iVar4 = (*(pIVar5->super_IContext)._vptr_IContext[4])(pIVar5);
  cVar3 = (**(code **)(**(long **)CONCAT44(extraout_var,iVar4) + 0x50))();
  if (cVar3 == '\0') {
    std::operator+(&local_50,'\"',str);
    std::operator+(__return_storage_ptr__,&local_50,'\"');
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"",(allocator<char> *)&local_50);
    pcVar1 = (str->_M_dataplus)._M_p;
    sVar2 = str->_M_string_length;
    for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
      cVar3 = pcVar1[sVar6];
      if ((cVar3 == '\t') || (cVar3 == '\n')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::string>::convert(const std::string& str) {
    if (!getCurrentContext().getConfig()->showInvisibles()) {
        return '"' + str + '"';
    }

    std::string s("\"");
    for (char c : str) {
        switch (c) {
        case '\n':
            s.append("\\n");
            break;
        case '\t':
            s.append("\\t");
            break;
        default:
            s.push_back(c);
            break;
        }
    }
    s.append("\"");
    return s;
}